

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_codecs.c
# Opt level: O3

int code_sort(void *vp1,void *vp2)

{
  int iVar1;
  
  iVar1 = *(int *)((long)vp1 + 0xc) - *(int *)((long)vp2 + 0xc);
  if (iVar1 == 0) {
    iVar1 = *vp1 - *vp2;
  }
  return iVar1;
}

Assistant:

static int code_sort(const void *vp1, const void *vp2) {
    const cram_huffman_code *c1 = (const cram_huffman_code *)vp1;
    const cram_huffman_code *c2 = (const cram_huffman_code *)vp2;

    if (c1->len != c2->len)
	return c1->len - c2->len;
    else
	return c1->symbol - c2->symbol;
}